

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACL.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Policies::ACL::list_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ACL *this)

{
  Client *client;
  Path local_50;
  Url local_30;
  
  client = *(Client **)this;
  local_50.value_._M_dataplus._M_p = (pointer)&local_50.value_.field_2;
  local_50.value_.field_2._M_allocated_capacity = 0;
  local_50.value_.field_2._8_8_ = 0;
  local_50.value_._M_string_length = 0;
  getUrl(&local_30,this,&local_50);
  Policies::list(__return_storage_ptr__,client,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::Policies::ACL::list() {
  return Vault::Sys::Policies::list(client_, getUrl(Path{}));
}